

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

void __thiscall
Mustache::Renderer::readSetDelimiter(Renderer *this,QString *content,int pos,int endPos)

{
  bool bVar1;
  int pos_00;
  char16_t cVar2;
  char16_t *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  QString endMarker;
  QString startMarker;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  pcVar3 = (content->d).ptr;
  lVar6 = (long)endPos;
  pos_00 = pos + -2;
  lVar5 = (long)pos;
  do {
    lVar4 = lVar5;
    cVar2 = pcVar3[lVar4];
    bVar1 = QChar::isSpace((uint)(ushort)cVar2);
    pos_00 = pos_00 + 1;
    if (lVar6 <= lVar4) break;
    lVar5 = lVar4 + 1;
  } while (bVar1);
  do {
    bVar1 = QChar::isSpace((uint)(ushort)cVar2);
    if ((lVar6 <= lVar4) || (bVar1)) break;
    if (cVar2 == L'=') {
      QString::QString((QString *)&local_80,"Custom delimiters may not contain \'=\'.");
      setError(this,(QString *)&local_80,pos_00 + 1);
      goto LAB_00112161;
    }
    QString::append((QChar)(char16_t)&local_48);
    pcVar3 = (content->d).ptr;
    cVar2 = pcVar3[lVar4 + 1];
    lVar4 = lVar4 + 1;
    pos_00 = pos_00 + 1;
  } while( true );
  while (lVar4 = lVar5 + 1, bVar1) {
    lVar5 = lVar4;
    cVar2 = pcVar3[lVar5];
    bVar1 = QChar::isSpace((uint)(ushort)cVar2);
    pos_00 = pos_00 + 1;
    if (lVar6 <= lVar5) break;
  }
  for (; (bVar1 = QChar::isSpace((uint)(ushort)cVar2), !bVar1 && (lVar5 < endPos + -1));
      lVar5 = lVar5 + 1) {
    if (cVar2 == L'=') {
      QString::QString((QString *)&local_80,"Custom delimiters may not contain \'=\'.");
      setError(this,(QString *)&local_80,pos_00);
LAB_00112161:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      goto LAB_0011216b;
    }
    QString::append((QChar)(char16_t)&local_68);
    cVar2 = (content->d).ptr[lVar5 + 1];
    pos_00 = pos_00 + 1;
  }
  QString::operator=(&this->m_tagStartMarker,(QString *)&local_48);
  QString::operator=(&this->m_tagEndMarker,(QString *)&local_68);
LAB_0011216b:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  return;
}

Assistant:

void Renderer::readSetDelimiter(const QString& content, int pos, int endPos)
{
	QString startMarker;
	QString endMarker;

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		startMarker += content.at(pos);
		++pos;
	}

	while (content.at(pos).isSpace() && pos < endPos) {
		++pos;
	}

	while (!content.at(pos).isSpace() && pos < endPos - 1) {
		if (content.at(pos) == '=') {
			setError("Custom delimiters may not contain '='.", pos);
			return;
		}
		endMarker += content.at(pos);
		++pos;
	}

	m_tagStartMarker = startMarker;
	m_tagEndMarker = endMarker;
}